

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O1

void __thiscall Assimp::Ogre::Skeleton::Reset(Skeleton *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppBVar2;
  Bone *pBVar3;
  pointer puVar4;
  pointer pcVar5;
  pointer ppAVar6;
  Animation *pAVar7;
  BoneList *__range2;
  Bone **bone;
  pointer ppBVar8;
  pointer ppAVar9;
  
  ppBVar2 = (this->bones).
            super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppBVar8 = (this->bones).
                 super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppBVar8 != ppBVar2; ppBVar8 = ppBVar8 + 1
      ) {
    pBVar3 = *ppBVar8;
    if (pBVar3 != (Bone *)0x0) {
      puVar4 = (pBVar3->children).
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (puVar4 != (pointer)0x0) {
        operator_delete(puVar4,(long)(pBVar3->children).
                                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)puVar4);
      }
      pcVar5 = (pBVar3->name)._M_dataplus._M_p;
      paVar1 = &(pBVar3->name).field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar5 != paVar1) {
        operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
      }
      operator_delete(pBVar3,0xf8);
    }
    *ppBVar8 = (Bone *)0x0;
  }
  ppBVar8 = (this->bones).
            super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->bones).super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppBVar8) {
    (this->bones).super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppBVar8;
  }
  ppAVar6 = (this->animations).
            super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppAVar9 = (this->animations).
                 super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppAVar9 != ppAVar6;
      ppAVar9 = ppAVar9 + 1) {
    pAVar7 = *ppAVar9;
    if (pAVar7 != (Animation *)0x0) {
      std::
      vector<Assimp::Ogre::VertexAnimationTrack,_std::allocator<Assimp::Ogre::VertexAnimationTrack>_>
      ::~vector(&pAVar7->tracks);
      pcVar5 = (pAVar7->baseName)._M_dataplus._M_p;
      paVar1 = &(pAVar7->baseName).field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar5 != paVar1) {
        operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
      }
      pcVar5 = (pAVar7->name)._M_dataplus._M_p;
      paVar1 = &(pAVar7->name).field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar5 != paVar1) {
        operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
      }
      operator_delete(pAVar7,0x70);
    }
    *ppAVar9 = (Animation *)0x0;
  }
  ppAVar9 = (this->animations).
            super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->animations).
      super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppAVar9) {
    (this->animations).
    super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppAVar9;
  }
  return;
}

Assistant:

void Skeleton::Reset()
{
    for(auto &bone : bones) {
        OGRE_SAFE_DELETE(bone)
    }
    bones.clear();
    for(auto &anim : animations) {
        OGRE_SAFE_DELETE(anim)
    }
    animations.clear();
}